

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::member_visitor_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  element_type *this;
  string *name;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff50;
  allocator *var;
  string *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff87;
  offset_in_member_visitor_to_subr *in_stack_ffffffffffffff88;
  string local_70 [32];
  code *local_50;
  undefined8 local_48;
  allocator local_21;
  string local_20 [32];
  
  this = std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*(in_stack_ffffffffffffff50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"get",&local_21);
  local_50 = member_visitor::get;
  local_48 = 0;
  cs::make_cni<cs_impl::any(cs_impl::member_visitor::*)()const>
            (in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
  name = (string *)
         cs::name_space::add_var(this,in_stack_ffffffffffffff58,(var *)in_stack_ffffffffffffff50);
  var = (allocator *)&stack0xffffffffffffff8f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"set",var);
  cs::make_cni<void(cs_impl::member_visitor::*)(cs_impl::any_const&)const>
            (in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
  cs::name_space::add_var(this,name,(var *)var);
  any::~any((any *)0x439660);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  any::~any((any *)0x43967e);
  std::__cxx11::string::~string(local_20);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return iVar1;
}

Assistant:

void init()
		{
			(*member_visitor_ext)
			.add_var("get", make_cni(&member_visitor::get, true))
			.add_var("set", make_cni(&member_visitor::set, true));
		}